

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O0

bool GifEnd(GifWriter *writer)

{
  long lVar1;
  long *in_RDI;
  
  lVar1 = *in_RDI;
  if (lVar1 != 0) {
    fputc(0x3b,(FILE *)*in_RDI);
    fclose((FILE *)*in_RDI);
    free((void *)in_RDI[1]);
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  return lVar1 != 0;
}

Assistant:

bool GifEnd( GifWriter* writer )
{
    if(!writer->f) return false;

    fputc(0x3b, writer->f); // end of file
    fclose(writer->f);
    GIF_FREE(writer->oldImage);

    writer->f = NULL;
    writer->oldImage = NULL;

    return true;
}